

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string_tests.cpp
# Opt level: O1

void check_encode_base64<wchar_t>
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *input,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *expected)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  pointer pwVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  ulong uVar7;
  long lVar8;
  pointer puVar9;
  pointer puVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> result;
  AssertionHandler catchAssertionHandler;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  long local_148;
  ITransientExpression local_140;
  SourceLineInfo *local_130;
  pointer local_128;
  pointer puStack_120;
  pointer *local_118;
  SourceLineInfo local_110;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_e0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_d8;
  pointer local_d0;
  pointer local_c8;
  AssertionHandler local_c0;
  StringRef local_78;
  StringRef local_68;
  pointer local_58;
  StringRef local_50;
  StringRef local_40;
  
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = L'\0';
  local_e0 = input;
  local_d8 = expected;
  jsoncons::detail::
  encode_base64_generic<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__cxx11::wstring>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/=",&local_100);
  local_140._vptr_ITransientExpression = (_func_int **)0x8189b6;
  local_140.m_isBinaryExpression = true;
  local_140.m_result = false;
  local_140._10_6_ = 0;
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/corelib/src/utility/byte_string_tests.cpp"
  ;
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x18;
  Catch::StringRef::StringRef(&local_40,"result.size() == expected.size()");
  Catch::AssertionHandler::AssertionHandler
            (&local_c0,(StringRef *)&local_140,(SourceLineInfo *)&local_168,local_40,Normal);
  sVar6 = local_100._M_string_length;
  local_110.file = (char *)local_100._M_string_length;
  puVar9 = (pointer)local_d8->_M_string_length;
  local_c8 = puVar9;
  Catch::StringRef::StringRef((StringRef *)&local_168,"==");
  local_140.m_result = (pointer)sVar6 == puVar9;
  local_140.m_isBinaryExpression = true;
  local_140._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b5a1f8;
  local_128 = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  puStack_120 = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_130 = &local_110;
  local_118 = &local_c8;
  Catch::AssertionHandler::handleExpr(&local_c0,&local_140);
  Catch::ITransientExpression::~ITransientExpression(&local_140);
  Catch::AssertionHandler::complete(&local_c0);
  if (local_c0.m_completed == false) {
    (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if ((pointer)local_100._M_string_length != (pointer)0x0) {
    lVar8 = 0;
    puVar9 = (pointer)0x0;
    do {
      local_140._vptr_ITransientExpression = (_func_int **)0x8102c5;
      local_140.m_isBinaryExpression = true;
      local_140.m_result = false;
      local_140._10_6_ = 0;
      local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/corelib/src/utility/byte_string_tests.cpp"
      ;
      local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x1b;
      local_d0 = puVar9;
      Catch::StringRef::StringRef(&local_68,"result[i] == expected[i]");
      Catch::AssertionHandler::AssertionHandler
                (&local_c0,(StringRef *)&local_140,(SourceLineInfo *)&local_168,local_68,
                 ContinueOnFailure);
      _Var5._M_p = local_100._M_dataplus._M_p;
      pwVar4 = (local_d8->_M_dataplus)._M_p;
      iVar2 = *(int *)((long)local_100._M_dataplus._M_p + lVar8);
      iVar3 = *(int *)((long)pwVar4 + lVar8);
      local_148 = lVar8;
      Catch::StringRef::StringRef((StringRef *)&local_168,"==");
      lVar8 = local_148;
      local_140.m_result = iVar2 == iVar3;
      local_140.m_isBinaryExpression = true;
      local_130 = (SourceLineInfo *)((long)_Var5._M_p + local_148);
      local_118 = (pointer *)((long)pwVar4 + local_148);
      local_140._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_00b72090;
      local_128 = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      puStack_120 = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      Catch::AssertionHandler::handleExpr(&local_c0,&local_140);
      Catch::ITransientExpression::~ITransientExpression(&local_140);
      puVar9 = local_d0;
      Catch::AssertionHandler::complete(&local_c0);
      if (local_c0.m_completed == false) {
        (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0xe])(local_c0.m_resultCapture,&local_c0)
        ;
      }
      puVar9 = puVar9 + 1;
      lVar8 = lVar8 + 4;
    } while (puVar9 < local_100._M_string_length);
  }
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  jsoncons::detail::
  decode_base64_generic<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,bool(*)(wchar_t),std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              )local_100._M_dataplus._M_p,
             (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              )(local_100._M_dataplus._M_p + local_100._M_string_length),
             jsoncons::
             decode_base64<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,std::vector<unsigned_char,std::allocator<unsigned_char>>>(__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,std::vector<unsigned_char,std::allocator<unsigned_char>>&)
             ::reverse_alphabet,jsoncons::is_base64<wchar_t>,&local_168);
  local_140._vptr_ITransientExpression = (_func_int **)0x8189b6;
  local_140.m_isBinaryExpression = true;
  local_140.m_result = false;
  local_140._10_6_ = 0;
  local_110.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/corelib/src/utility/byte_string_tests.cpp"
  ;
  local_110.line = 0x20;
  Catch::StringRef::StringRef(&local_50,"output.size() == input.size()");
  Catch::AssertionHandler::AssertionHandler
            (&local_c0,(StringRef *)&local_140,&local_110,local_50,Normal);
  puVar9 = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish +
           -(long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
  puVar10 = (local_e0->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish +
            -(long)(local_e0->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
  local_c8 = puVar9;
  local_58 = puVar10;
  Catch::StringRef::StringRef((StringRef *)&local_110,"==");
  local_140.m_result = puVar9 == puVar10;
  local_140.m_isBinaryExpression = true;
  local_140._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b5a1f8;
  local_130 = (SourceLineInfo *)&local_c8;
  local_128 = (pointer)local_110.file;
  puStack_120 = (pointer)local_110.line;
  local_118 = &local_58;
  Catch::AssertionHandler::handleExpr(&local_c0,&local_140);
  Catch::ITransientExpression::~ITransientExpression(&local_140);
  Catch::AssertionHandler::complete(&local_c0);
  if (local_c0.m_completed == false) {
    (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      local_140._vptr_ITransientExpression = (_func_int **)0x8102c5;
      local_140.m_isBinaryExpression = true;
      local_140.m_result = false;
      local_140._10_6_ = 0;
      local_110.file =
           "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/corelib/src/utility/byte_string_tests.cpp"
      ;
      local_110.line = 0x23;
      Catch::StringRef::StringRef(&local_78,"output[i] == input[i]");
      Catch::AssertionHandler::AssertionHandler
                (&local_c0,(StringRef *)&local_140,&local_110,local_78,ContinueOnFailure);
      puVar10 = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar9 = (local_e0->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      local_148 = CONCAT71(local_148._1_7_,
                           local_168.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar7]);
      uVar1 = puVar9[uVar7];
      Catch::StringRef::StringRef((StringRef *)&local_110,"==");
      local_140.m_result = (uchar)local_148 == uVar1;
      local_140.m_isBinaryExpression = true;
      local_130 = (SourceLineInfo *)(puVar10 + uVar7);
      local_118 = (pointer *)(puVar9 + uVar7);
      local_140._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_00b5a238;
      local_128 = (pointer)local_110.file;
      puStack_120 = (pointer)local_110.line;
      Catch::AssertionHandler::handleExpr(&local_c0,&local_140);
      Catch::ITransientExpression::~ITransientExpression(&local_140);
      Catch::AssertionHandler::complete(&local_c0);
      if (local_c0.m_completed == false) {
        (*(local_c0.m_resultCapture)->_vptr_IResultCapture[0xe])(local_c0.m_resultCapture,&local_c0)
        ;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)local_168.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_168.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start));
  }
  if (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT44(local_100.field_2._M_local_buf[1],local_100.field_2._M_local_buf[0]) *
                    4 + 4);
  }
  return;
}

Assistant:

void check_encode_base64(const std::vector<uint8_t>& input, const std::basic_string<CharT>& expected)
{
    std::basic_string<CharT> result;
    encode_base64(input.begin(),input.end(),result);
    REQUIRE(result.size() == expected.size());
    for (std::size_t i = 0; i < result.size(); ++i)
    {
        CHECK(result[i] == expected[i]);
    }

    std::vector<uint8_t> output;
    decode_base64(result.begin(), result.end(), output);
    REQUIRE(output.size() == input.size());
    for (std::size_t i = 0; i < output.size(); ++i)
    {
        CHECK(output[i] == input[i]);
    }
}